

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall ImFont::ClearOutputData(ImFont *this)

{
  ImVector<ImFontGlyph> *in_RDI;
  
  in_RDI->Size = 0;
  ImVector<ImFontGlyph>::clear(in_RDI);
  ImVector<float>::clear((ImVector<float> *)in_RDI);
  ImVector<unsigned_short>::clear((ImVector<unsigned_short> *)in_RDI);
  in_RDI[4].Size = 0;
  in_RDI[4].Capacity = 0;
  *(undefined4 *)&in_RDI[4].Data = 0;
  *(undefined2 *)((long)&in_RDI[4].Data + 6) = 0;
  in_RDI[5].Size = 0;
  in_RDI[5].Capacity = 0;
  in_RDI[5].Data = (ImFontGlyph *)0x0;
  in_RDI[6].Capacity = 0;
  in_RDI[6].Size = 0;
  *(undefined1 *)&in_RDI[6].Data = 1;
  *(undefined4 *)((long)&in_RDI[6].Data + 4) = 0;
  return;
}

Assistant:

void    ImFont::ClearOutputData()
{
    FontSize = 0.0f;
    Glyphs.clear();
    IndexAdvanceX.clear();
    IndexLookup.clear();
    FallbackGlyph = NULL;
    FallbackAdvanceX = 0.0f;
    ConfigDataCount = 0;
    ConfigData = NULL;
    ContainerAtlas = NULL;
    Ascent = Descent = 0.0f;
    DirtyLookupTables = true;
    MetricsTotalSurface = 0;
}